

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::scaleElement(SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *lp,int row,int col,
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *val)

{
  int *piVar1;
  int in_ECX;
  long in_RDX;
  cpp_dec_float<50U,_int,_void> *in_RDI;
  int in_R8D;
  DataArray<int> *rowscaleExp;
  DataArray<int> *colscaleExp;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  int iVar2;
  cpp_dec_float<50U,_int,_void> *this_00;
  undefined1 local_d0 [44];
  int in_stack_ffffffffffffff5c;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_ffffffffffffff60;
  undefined1 local_98 [56];
  DataArray<int> *local_60;
  DataArray<int> *local_58;
  int local_48;
  int local_44;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_8;
  
  local_58 = (DataArray<int> *)(in_RDX + 0x178);
  local_60 = (DataArray<int> *)(in_RDX + 0xb0);
  local_20 = local_d0;
  this_00 = in_RDI;
  local_48 = in_R8D;
  local_44 = in_ECX;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (in_RDI,(cpp_dec_float<50U,_int,_void> *)
                    CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  piVar1 = DataArray<int>::operator[](local_58,local_48);
  iVar2 = *piVar1;
  DataArray<int>::operator[](local_60,local_44);
  spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c);
  local_18 = local_98;
  local_8 = local_18;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            (this_00,(cpp_dec_float<50U,_int,_void> *)CONCAT44(iVar2,in_stack_ffffffffffffff18));
  return (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *)in_RDI;
}

Assistant:

R SPxScaler<R>::scaleElement(const SPxLPBase<R>& lp, int row, int col, R val) const
{
   assert(lp.isScaled());
   assert(col < lp.nCols());
   assert(col >= 0);
   assert(row < lp.nRows());
   assert(row >= 0);

   const DataArray < int >& colscaleExp = lp.LPColSetBase<R>::scaleExp;
   const DataArray < int >& rowscaleExp = lp.LPRowSetBase<R>::scaleExp;

   return spxLdexp(val, colscaleExp[col] + rowscaleExp[row]);
}